

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O1

void __thiscall
MADPComponentDiscreteObservations::AddObservation
          (MADPComponentDiscreteObservations *this,Index AI,string *name,string *description)

{
  pointer puVar1;
  iterator __position;
  unsigned_long uVar2;
  ulong uVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  ulong uVar6;
  vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_> thisAgentsObservations;
  stringstream ss;
  vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_> local_1d8;
  undefined1 local_1b8 [72];
  undefined **local_170;
  Index local_168;
  
  uVar3 = (ulong)AI;
  puVar1 = (this->_m_nrObservations).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->_m_nrObservations).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (long)__position._M_current - (long)puVar1 >> 3;
  if (uVar6 == AI + 1 || uVar6 == uVar3) {
    if (uVar6 == uVar3) {
      local_1b8._0_8_ = (_func_int **)0x1;
      if (__position._M_current ==
          (this->_m_nrObservations).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&this->_m_nrObservations,__position,(unsigned_long *)local_1b8);
      }
      else {
        *__position._M_current = 1;
        (this->_m_nrObservations).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      local_1d8.super__Vector_base<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.super__Vector_base<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.super__Vector_base<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      NamedDescribedEntity::NamedDescribedEntity((NamedDescribedEntity *)local_1b8,name,description)
      ;
      local_168 = 0;
      local_1b8._0_8_ = &PTR__ObservationDiscrete_005d0ed8;
      local_170 = &PTR__ObservationDiscrete_005d0f08;
      std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>::push_back
                (&local_1d8,(value_type *)local_1b8);
      std::
      vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
      ::push_back(&this->_m_observationVecs,&local_1d8);
      NamedDescribedEntity::~NamedDescribedEntity((NamedDescribedEntity *)local_1b8);
      std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>::~vector(&local_1d8);
    }
    else {
      uVar2 = puVar1[uVar3];
      puVar1[uVar3] = uVar2 + 1;
      NamedDescribedEntity::NamedDescribedEntity((NamedDescribedEntity *)local_1b8,name,description)
      ;
      local_168 = (Index)uVar2;
      local_1b8._0_8_ = &PTR__ObservationDiscrete_005d0ed8;
      local_170 = &PTR__ObservationDiscrete_005d0f08;
      std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>::push_back
                ((this->_m_observationVecs).
                 super__Vector_base<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar3,(value_type *)local_1b8);
      NamedDescribedEntity::~NamedDescribedEntity((NamedDescribedEntity *)local_1b8);
    }
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),"MADPComponentDiscreteObservations::AddObservation(",0x32
            );
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,") - error, observations of agents should be specified in order!",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4," first all observations of agent 1, then all of agent 2,...etc...",0x41);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," _m_nrObservations.size now is: ",0x20)
  ;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"\n(the vector _m_nrObservations should contain entries for all ",0x3e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"preceeding agents.)",0x13);
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar5 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar5,&E::typeinfo,E::~E);
}

Assistant:

void MADPComponentDiscreteObservations::AddObservation(Index AI,
                                                       const string &name,
                                                       const string &description)
{
    if(DEBUG_ADD_DO) 
        cerr<<"MADPComponentDiscreteObservation::AddObservation("<<AI<<","<<name<<")"
            <<endl;    

    if(_m_nrObservations.size() != AI && _m_nrObservations.size() != AI+1)
    {
        stringstream ss;
        ss << "MADPComponentDiscreteObservations::AddObservation("<<AI<<","<<name<<
            ") - error, observations of agents should be specified in order!"<<
            " first all observations of agent 1, then all of agent 2,...etc..."<<
            " _m_nrObservations.size now is: "<< _m_nrObservations.size() <<
            "\n(the vector _m_nrObservations should contain entries for all "<<
            "preceeding agents.)";
        throw(E(ss));
    }
    if(_m_nrObservations.size() == AI )
    {
        //this is the first observation we add for this agent
        _m_nrObservations.push_back(1);

        vector<ObservationDiscrete> thisAgentsObservations;
        ObservationDiscrete ad(0, name, description);
        thisAgentsObservations.push_back(ad);
        _m_observationVecs.push_back(thisAgentsObservations);
    }
    else
    {
        //we add an observation for this agent - increment his nr_observations
        Index newObservationIndex = _m_nrObservations[AI]++;
        ObservationDiscrete ad(newObservationIndex, name, description);
        _m_observationVecs[AI].push_back(ad);
    }
}